

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Compound *type)

{
  ostream *poVar1;
  ulong uVar2;
  TlbExportVisitor local_d0 [32];
  undefined1 local_b0 [8];
  Indent indenter;
  string local_58 [32];
  anon_unknown_dwarf_39db local_38 [32];
  Compound *local_18;
  Compound *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = type;
  type_local = (Compound *)this;
  poVar1 = std::operator<<(this->m_stream,"<compound name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(local_38,local_58);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  uVar2 = Typelib::Type::getSize();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
            ((TlbExportVisitor *)&indenter.field_0x20);
  poVar1 = std::operator<<(poVar1,(string *)&indenter.field_0x20);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&indenter.field_0x20);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  Indent::Indent((Indent *)local_b0,&this->m_indent);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent((Indent *)local_b0);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_d0,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_d0);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</compound>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type)
    {
        m_stream << "<compound name=\"" << xmlEscape(type.getName()) << "\" size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</compound>";

        return true;
    }